

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

Layer * ncnn::Input_layer_creator(void)

{
  Layer *this;
  
  this = (Layer *)operator_new(200);
  Layer::Layer(this);
  this->_vptr_Layer = (_func_int **)&PTR__Layer_001a2f20;
  this->one_blob_only = true;
  this->support_inplace = true;
  this->support_vulkan = true;
  this->support_packing = true;
  this->support_bf16_storage = true;
  this->support_image_storage = true;
  return this;
}

Assistant:

Input::Input()
{
    one_blob_only = true;
    support_inplace = true;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
    support_image_storage = true;
}